

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jidctint.c
# Opt level: O0

void jpeg_idct_6x6(j_decompress_ptr cinfo,jpeg_component_info *compptr,JCOEFPTR coef_block,
                  JSAMPARRAY output_buf,JDIMENSION output_col)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  undefined1 *puVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long in_RCX;
  short *in_RDX;
  long in_RSI;
  long in_RDI;
  uint in_R8D;
  int ctr;
  JSAMPLE *range_limit;
  JSAMPROW outptr;
  int *wsptr;
  ISLOW_MULT_TYPE *quantptr;
  JCOEFPTR inptr;
  JLONG z3;
  JLONG z2;
  JLONG z1;
  JLONG tmp12;
  JLONG tmp11;
  JLONG tmp10;
  JLONG tmp2;
  JLONG tmp1;
  JLONG tmp0;
  int local_138 [6];
  int local_120 [6];
  int local_108 [6];
  int local_f0 [6];
  int local_d8 [6];
  int local_c0 [9];
  int local_9c;
  long local_98;
  int *local_88;
  short *local_80;
  short *local_78;
  long local_58;
  int local_50;
  long local_48;
  long local_40;
  int local_38;
  long local_30;
  uint local_24;
  long local_20;
  
  local_98 = *(long *)(in_RDI + 0x1a8) + 0x80;
  local_80 = *(short **)(in_RSI + 0x58);
  local_88 = local_138;
  local_78 = in_RDX;
  local_24 = in_R8D;
  local_20 = in_RCX;
  for (local_9c = 0; local_9c < 6; local_9c = local_9c + 1) {
    lVar4 = (long)((int)*local_78 * (int)*local_80) * 0x2000 + 0x400;
    lVar5 = (long)((int)local_78[0x20] * (int)local_80[0x20]);
    local_58 = lVar4 + lVar5 * 0x16a1;
    local_50 = (int)(lVar4 + lVar5 * -0x16a1 + lVar5 * -0x16a1 >> 0xb);
    local_48 = local_58 + (long)((int)local_78[0x10] * (int)local_80[0x10]) * 0x2731;
    local_58 = local_58 + (long)((int)local_78[0x10] * (int)local_80[0x10]) * -0x2731;
    iVar1 = (int)local_78[8] * (int)local_80[8];
    iVar2 = (int)local_78[0x18] * (int)local_80[0x18];
    iVar3 = (int)local_78[0x28] * (int)local_80[0x28];
    local_40 = ((long)iVar1 + (long)iVar3) * 0xbb6;
    local_30 = local_40 + ((long)iVar1 + (long)iVar2) * 0x2000;
    local_40 = local_40 + ((long)iVar3 - (long)iVar2) * 0x2000;
    local_38 = ((iVar1 - iVar2) - iVar3) * 4;
    *local_88 = (int)(local_48 + local_30 >> 0xb);
    local_88[0x1e] = (int)(local_48 - local_30 >> 0xb);
    local_88[6] = local_50 + local_38;
    local_88[0x18] = local_50 - local_38;
    local_88[0xc] = (int)(local_58 + local_40 >> 0xb);
    local_88[0x12] = (int)(local_58 - local_40 >> 0xb);
    local_78 = local_78 + 1;
    local_80 = local_80 + 1;
    local_88 = local_88 + 1;
  }
  local_88 = local_138;
  for (local_9c = 0; local_9c < 6; local_9c = local_9c + 1) {
    puVar6 = (undefined1 *)(*(long *)(local_20 + (long)local_9c * 8) + (ulong)local_24);
    lVar4 = ((long)*local_88 + 0x10) * 0x2000;
    lVar5 = (long)local_88[4];
    lVar7 = lVar4 + lVar5 * 0x16a1;
    lVar4 = lVar4 + lVar5 * -0x16a1 + lVar5 * -0x16a1;
    lVar5 = lVar7 + (long)local_88[2] * 0x2731;
    lVar7 = lVar7 + (long)local_88[2] * -0x2731;
    lVar8 = (long)local_88[1];
    lVar9 = (long)local_88[3];
    lVar10 = (long)local_88[5];
    lVar11 = (lVar8 + lVar10) * 0xbb6;
    lVar12 = lVar11 + (lVar8 + lVar9) * 0x2000;
    lVar11 = lVar11 + (lVar10 - lVar9) * 0x2000;
    lVar10 = (lVar8 - lVar9) - lVar10;
    *puVar6 = *(undefined1 *)(local_98 + (int)((uint)(lVar5 + lVar12 >> 0x12) & 0x3ff));
    puVar6[5] = *(undefined1 *)(local_98 + (int)((uint)(lVar5 - lVar12 >> 0x12) & 0x3ff));
    puVar6[1] = *(undefined1 *)(local_98 + (int)((uint)(lVar4 + lVar10 * 0x2000 >> 0x12) & 0x3ff));
    puVar6[4] = *(undefined1 *)(local_98 + (int)((uint)(lVar4 + lVar10 * -0x2000 >> 0x12) & 0x3ff));
    puVar6[2] = *(undefined1 *)(local_98 + (int)((uint)(lVar7 + lVar11 >> 0x12) & 0x3ff));
    puVar6[3] = *(undefined1 *)(local_98 + (int)((uint)(lVar7 - lVar11 >> 0x12) & 0x3ff));
    local_88 = local_88 + 6;
  }
  return;
}

Assistant:

GLOBAL(void)
jpeg_idct_6x6(j_decompress_ptr cinfo, jpeg_component_info *compptr,
              JCOEFPTR coef_block, JSAMPARRAY output_buf,
              JDIMENSION output_col)
{
  JLONG tmp0, tmp1, tmp2, tmp10, tmp11, tmp12;
  JLONG z1, z2, z3;
  JCOEFPTR inptr;
  ISLOW_MULT_TYPE *quantptr;
  int *wsptr;
  JSAMPROW outptr;
  JSAMPLE *range_limit = IDCT_range_limit(cinfo);
  int ctr;
  int workspace[6 * 6];         /* buffers data between passes */
  SHIFT_TEMPS

  /* Pass 1: process columns from input, store into work array. */

  inptr = coef_block;
  quantptr = (ISLOW_MULT_TYPE *)compptr->dct_table;
  wsptr = workspace;
  for (ctr = 0; ctr < 6; ctr++, inptr++, quantptr++, wsptr++) {
    /* Even part */

    tmp0 = DEQUANTIZE(inptr[DCTSIZE * 0], quantptr[DCTSIZE * 0]);
    tmp0 = LEFT_SHIFT(tmp0, CONST_BITS);
    /* Add fudge factor here for final descale. */
    tmp0 += ONE << (CONST_BITS - PASS1_BITS - 1);
    tmp2 = DEQUANTIZE(inptr[DCTSIZE * 4], quantptr[DCTSIZE * 4]);
    tmp10 = MULTIPLY(tmp2, FIX(0.707106781));   /* c4 */
    tmp1 = tmp0 + tmp10;
    tmp11 = RIGHT_SHIFT(tmp0 - tmp10 - tmp10, CONST_BITS - PASS1_BITS);
    tmp10 = DEQUANTIZE(inptr[DCTSIZE * 2], quantptr[DCTSIZE * 2]);
    tmp0 = MULTIPLY(tmp10, FIX(1.224744871));   /* c2 */
    tmp10 = tmp1 + tmp0;
    tmp12 = tmp1 - tmp0;

    /* Odd part */

    z1 = DEQUANTIZE(inptr[DCTSIZE * 1], quantptr[DCTSIZE * 1]);
    z2 = DEQUANTIZE(inptr[DCTSIZE * 3], quantptr[DCTSIZE * 3]);
    z3 = DEQUANTIZE(inptr[DCTSIZE * 5], quantptr[DCTSIZE * 5]);
    tmp1 = MULTIPLY(z1 + z3, FIX(0.366025404)); /* c5 */
    tmp0 = tmp1 + LEFT_SHIFT(z1 + z2, CONST_BITS);
    tmp2 = tmp1 + LEFT_SHIFT(z3 - z2, CONST_BITS);
    tmp1 = LEFT_SHIFT(z1 - z2 - z3, PASS1_BITS);

    /* Final output stage */

    wsptr[6 * 0] = (int)RIGHT_SHIFT(tmp10 + tmp0, CONST_BITS - PASS1_BITS);
    wsptr[6 * 5] = (int)RIGHT_SHIFT(tmp10 - tmp0, CONST_BITS - PASS1_BITS);
    wsptr[6 * 1] = (int)(tmp11 + tmp1);
    wsptr[6 * 4] = (int)(tmp11 - tmp1);
    wsptr[6 * 2] = (int)RIGHT_SHIFT(tmp12 + tmp2, CONST_BITS - PASS1_BITS);
    wsptr[6 * 3] = (int)RIGHT_SHIFT(tmp12 - tmp2, CONST_BITS - PASS1_BITS);
  }

  /* Pass 2: process 6 rows from work array, store into output array. */

  wsptr = workspace;
  for (ctr = 0; ctr < 6; ctr++) {
    outptr = output_buf[ctr] + output_col;

    /* Even part */

    /* Add fudge factor here for final descale. */
    tmp0 = (JLONG)wsptr[0] + (ONE << (PASS1_BITS + 2));
    tmp0 = LEFT_SHIFT(tmp0, CONST_BITS);
    tmp2 = (JLONG)wsptr[4];
    tmp10 = MULTIPLY(tmp2, FIX(0.707106781));   /* c4 */
    tmp1 = tmp0 + tmp10;
    tmp11 = tmp0 - tmp10 - tmp10;
    tmp10 = (JLONG)wsptr[2];
    tmp0 = MULTIPLY(tmp10, FIX(1.224744871));   /* c2 */
    tmp10 = tmp1 + tmp0;
    tmp12 = tmp1 - tmp0;

    /* Odd part */

    z1 = (JLONG)wsptr[1];
    z2 = (JLONG)wsptr[3];
    z3 = (JLONG)wsptr[5];
    tmp1 = MULTIPLY(z1 + z3, FIX(0.366025404)); /* c5 */
    tmp0 = tmp1 + LEFT_SHIFT(z1 + z2, CONST_BITS);
    tmp2 = tmp1 + LEFT_SHIFT(z3 - z2, CONST_BITS);
    tmp1 = LEFT_SHIFT(z1 - z2 - z3, CONST_BITS);

    /* Final output stage */

    outptr[0] = range_limit[(int)RIGHT_SHIFT(tmp10 + tmp0,
                                             CONST_BITS + PASS1_BITS + 3) &
                            RANGE_MASK];
    outptr[5] = range_limit[(int)RIGHT_SHIFT(tmp10 - tmp0,
                                             CONST_BITS + PASS1_BITS + 3) &
                            RANGE_MASK];
    outptr[1] = range_limit[(int)RIGHT_SHIFT(tmp11 + tmp1,
                                             CONST_BITS + PASS1_BITS + 3) &
                            RANGE_MASK];
    outptr[4] = range_limit[(int)RIGHT_SHIFT(tmp11 - tmp1,
                                             CONST_BITS + PASS1_BITS + 3) &
                            RANGE_MASK];
    outptr[2] = range_limit[(int)RIGHT_SHIFT(tmp12 + tmp2,
                                             CONST_BITS + PASS1_BITS + 3) &
                            RANGE_MASK];
    outptr[3] = range_limit[(int)RIGHT_SHIFT(tmp12 - tmp2,
                                             CONST_BITS + PASS1_BITS + 3) &
                            RANGE_MASK];

    wsptr += 6;         /* advance pointer to next row */
  }
}